

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

void cppqc::detail::TupleGeneratorHelper_shrink<0,Rectangle>::
     appendShrinks<std::tuple<cppqc::Generator<Rectangle>>>
               (tuple<Rectangle> *shrinkInput,
               vector<std::tuple<Rectangle>,_std::allocator<std::tuple<Rectangle>_>_> *shrinkOutput,
               tuple<cppqc::Generator<Rectangle>_> *generators)

{
  int iVar1;
  bool bVar2;
  vector<Rectangle,_std::allocator<Rectangle>_> *this;
  __tuple_element_t<0UL,_tuple<Rectangle>_> *p_Var3;
  tuple<cppqc::Generator<Rectangle>_> *in_RDX;
  vector<std::tuple<Rectangle>,_std::allocator<std::tuple<Rectangle>_>_> *in_RSI;
  tuple<Rectangle> *in_RDI;
  tuple<Rectangle> copiedShrinkInput;
  Rectangle *localShrink;
  iterator __end0;
  iterator __begin0;
  vector<Rectangle,_std::allocator<Rectangle>_> *__range3;
  vector<Rectangle,_std::allocator<Rectangle>_> allLocalShrinks;
  vector<Rectangle,_std::allocator<Rectangle>_> *in_stack_ffffffffffffff78;
  reference in_stack_ffffffffffffff80;
  Generator<Rectangle> *in_stack_ffffffffffffff88;
  __normal_iterator<Rectangle_*,_std::vector<Rectangle,_std::allocator<Rectangle>_>_> local_40;
  undefined1 *local_38;
  undefined1 local_30 [24];
  tuple<cppqc::Generator<Rectangle>_> *local_18;
  vector<std::tuple<Rectangle>,_std::allocator<std::tuple<Rectangle>_>_> *local_10;
  tuple<Rectangle> *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  this = (vector<Rectangle,_std::allocator<Rectangle>_> *)
         std::get<0ul,cppqc::Generator<Rectangle>>((tuple<cppqc::Generator<Rectangle>_> *)0x1177c3);
  std::get<0ul,Rectangle>((tuple<Rectangle> *)0x1177d5);
  Generator<Rectangle>::shrink(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_38 = local_30;
  local_40._M_current =
       (Rectangle *)
       std::vector<Rectangle,_std::allocator<Rectangle>_>::begin(in_stack_ffffffffffffff78);
  std::vector<Rectangle,_std::allocator<Rectangle>_>::end(in_stack_ffffffffffffff78);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<Rectangle_*,_std::vector<Rectangle,_std::allocator<Rectangle>_>_>
                        *)in_stack_ffffffffffffff80,
                       (__normal_iterator<Rectangle_*,_std::vector<Rectangle,_std::allocator<Rectangle>_>_>
                        *)in_stack_ffffffffffffff78);
    if (!bVar2) break;
    in_stack_ffffffffffffff80 =
         __gnu_cxx::
         __normal_iterator<Rectangle_*,_std::vector<Rectangle,_std::allocator<Rectangle>_>_>::
         operator*(&local_40);
    p_Var3 = std::get<0ul,Rectangle>((tuple<Rectangle> *)0x11785c);
    iVar1 = in_stack_ffffffffffffff80->height;
    p_Var3->width = in_stack_ffffffffffffff80->width;
    p_Var3->height = iVar1;
    std::vector<std::tuple<Rectangle>,_std::allocator<std::tuple<Rectangle>_>_>::push_back
              ((vector<std::tuple<Rectangle>,_std::allocator<std::tuple<Rectangle>_>_> *)
               in_stack_ffffffffffffff80,(value_type *)in_stack_ffffffffffffff78);
    __gnu_cxx::__normal_iterator<Rectangle_*,_std::vector<Rectangle,_std::allocator<Rectangle>_>_>::
    operator++(&local_40);
  }
  TupleGeneratorHelper_shrink<-1,Rectangle>::appendShrinks<std::tuple<cppqc::Generator<Rectangle>>>
            (local_8,local_10,local_18);
  std::vector<Rectangle,_std::allocator<Rectangle>_>::~vector(this);
  return;
}

Assistant:

static void appendShrinks(const std::tuple<T...>& shrinkInput,
                            std::vector<std::tuple<T...>>& shrinkOutput,
                            const Generators& generators) {
    // Compute all shrink combinations for the tuple
    // element at the position "offset".
    // All other elements will not be changed.
    static_assert(offset >= 0 && offset < sizeof...(T), "offset out of bounds");
    auto allLocalShrinks =
        std::get<offset>(generators).shrink(std::get<offset>(shrinkInput));
    for (auto&& localShrink : allLocalShrinks) {
      auto copiedShrinkInput = shrinkInput;
      std::get<offset>(copiedShrinkInput) = std::move(localShrink);
      shrinkOutput.push_back(std::move(copiedShrinkInput));
    }

    // continue recursion (from right to left)
    TupleGeneratorHelper_shrink<offset - 1, T...>::appendShrinks(
        shrinkInput, shrinkOutput, generators);
  }